

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_fast_extState
              (void *state,char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  ulong *puVar1;
  short sVar2;
  char cVar3;
  BYTE *s;
  long *plVar4;
  short *psVar5;
  ulong uVar6;
  int iVar7;
  long *plVar8;
  int *piVar9;
  ulong *puVar10;
  int iVar11;
  int iVar12;
  ulong *puVar13;
  long lVar14;
  ulong *puVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  uint uVar19;
  BYTE *e_1;
  uint uVar20;
  uint uVar21;
  long *plVar22;
  int *piVar23;
  ulong uVar24;
  ulong *puVar25;
  short *psVar26;
  ulong uVar27;
  char cVar28;
  char *pcVar29;
  long lVar30;
  BYTE *e;
  int *piVar31;
  int *piVar32;
  long lVar33;
  ulong uVar34;
  BYTE *d;
  long *plVar35;
  ulong uVar36;
  int iVar37;
  int iVar38;
  uint uVar39;
  BYTE *s_2;
  char *pcVar40;
  bool bVar41;
  U16 *hashTable;
  long *local_b8;
  long *local_b0;
  
  pcVar18 = (char *)(ulong)(uint)acceleration;
  piVar9 = (int *)(ulong)(uint)inputSize;
  iVar37 = 0;
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    memset(state,0,0x4020);
  }
  else {
    state = (void *)0x0;
  }
  iVar7 = 1;
  if (1 < acceleration) {
    iVar7 = acceleration;
  }
  if (0x10000 < iVar7) {
    iVar7 = 0x10001;
  }
  if ((uint)inputSize < 0x7e000001) {
    iVar37 = (uint)((ulong)(uint)inputSize * 0x8080808081 >> 0x27) + 0x10;
  }
  iVar38 = (int)dest;
  if (maxOutputSize < iVar37) {
    if (inputSize < 0x1000b) {
      if (0x7e000000 < (uint)inputSize) {
        return 0;
      }
      if (inputSize != 0) {
        uVar19 = *(uint *)((long)state + 0x4010);
        pcVar16 = source + (long)piVar9;
        pcVar40 = dest + maxOutputSize;
        *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
        *(uint *)((long)state + 0x4010) = uVar19 + inputSize;
        *(undefined4 *)((long)state + 0x4014) = 3;
        local_b8 = (long *)dest;
        if (0xc < inputSize) {
          lVar14 = (long)source - (ulong)uVar19;
          *(short *)((long)state + (ulong)((uint)(*(int *)source * -0x61c8864f) >> 0x13) * 2) =
               (short)uVar19;
          piVar31 = (int *)(source + 1);
          uVar19 = (uint)(*(int *)(source + 1) * -0x61c8864f) >> 0x13;
          piVar23 = (int *)source;
          do {
            uVar21 = 1;
            piVar32 = piVar31;
            uVar20 = iVar7 << 6;
            do {
              piVar31 = piVar32;
              piVar32 = (int *)((ulong)uVar21 + (long)piVar31);
              sVar2 = (short)lVar14;
              if (source + (long)piVar9 + -0xb < piVar32) {
                iVar37 = 2;
              }
              else {
                uVar34 = (ulong)*(ushort *)((long)state + (ulong)uVar19 * 2);
                iVar12 = *piVar32;
                *(short *)((long)state + (ulong)uVar19 * 2) = (short)piVar31 - sVar2;
                iVar37 = 7;
                if (*(int *)(lVar14 + uVar34) != *piVar31) {
                  iVar37 = 0;
                }
                pcVar18 = (char *)(uVar34 + lVar14);
                uVar19 = (uint)(iVar12 * -0x61c8864f) >> 0x13;
              }
              uVar21 = uVar20 >> 6;
              uVar20 = uVar20 + 1;
            } while (iVar37 == 0);
            if (iVar37 == 7) {
              iVar37 = 0;
            }
            plVar35 = local_b8;
            if (iVar37 == 0) {
              uVar21 = (int)piVar31 - (int)piVar23;
              lVar33 = 0;
              cVar3 = (char)piVar31 * '\x10' + (char)piVar23 * -0x10;
              uVar20 = uVar21 - 0xf;
              do {
                uVar39 = uVar20;
                cVar28 = cVar3;
                lVar30 = lVar33;
                pcVar17 = pcVar18 + lVar30;
                piVar32 = (int *)((long)piVar31 + lVar30);
                if ((pcVar17 <= source) || (piVar32 <= piVar23)) break;
                lVar33 = lVar30 + -1;
                cVar3 = cVar28 + -0x10;
                uVar20 = uVar39 - 1;
              } while (*(char *)((long)piVar31 + lVar30 + -1) == pcVar18[lVar30 + -1]);
              iVar37 = (int)lVar30;
              uVar34 = (ulong)(uint)(iVar37 + ((int)piVar31 - (int)piVar23));
              plVar35 = (long *)((long)local_b8 + 1);
              pcVar29 = (char *)((long)local_b8 +
                                ((ulong)uVar21 + lVar30 & 0xffffffff) / 0xff + uVar34 + 9);
              if (pcVar40 < pcVar29) {
                iVar37 = 1;
              }
              else {
                if ((uint)((ulong)uVar21 + lVar30) < 0xf) {
                  *(char *)local_b8 = cVar28;
                  psVar5 = (short *)plVar35;
                }
                else {
                  uVar6 = (ulong)(uVar21 - 0xf) + lVar30;
                  *(char *)local_b8 = -0x10;
                  if (0xfe < (int)uVar6) {
                    if (0x1fc < (int)uVar39) {
                      uVar39 = 0x1fd;
                    }
                    uVar20 = (uVar21 - uVar39) + iVar37 + 0xef;
                    uVar6 = (ulong)uVar20 / 0xff;
                    memset(plVar35,0xff,(ulong)(uVar20 / 0xff + 1));
                    plVar35 = (long *)((long)local_b8 + uVar6 + 2);
                    uVar6 = (ulong)((uVar21 - 0x10e) + iVar37 + (int)uVar6 * -0xff);
                  }
                  *(char *)plVar35 = (char)uVar6;
                  psVar5 = (short *)((long)plVar35 + 1);
                }
                plVar35 = (long *)(uVar34 + (long)psVar5);
                piVar31 = piVar23;
                do {
                  *(undefined8 *)psVar5 = *(undefined8 *)piVar31;
                  psVar5 = psVar5 + 4;
                  piVar31 = piVar31 + 2;
                } while (psVar5 < plVar35);
                iVar37 = 0;
              }
              pcVar18 = pcVar17;
              piVar31 = piVar32;
              if (pcVar29 <= pcVar40) {
                do {
                  *(short *)plVar35 = (short)piVar32 - (short)pcVar17;
                  puVar1 = (ulong *)(piVar32 + 1);
                  puVar15 = (ulong *)(pcVar17 + 4);
                  puVar10 = puVar1;
                  piVar31 = piVar23;
                  if (puVar1 < pcVar16 + -0xc) {
                    uVar6 = *(ulong *)(piVar32 + 1) ^ *(ulong *)(pcVar17 + 4);
                    uVar34 = 0;
                    if (uVar6 != 0) {
                      for (; (uVar6 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                      }
                    }
                    piVar31 = (int *)(uVar34 >> 3 & 0x1fffffff);
                    uVar20 = (uint)piVar31;
                    puVar10 = (ulong *)(piVar32 + 3);
                    puVar15 = (ulong *)(pcVar17 + 0xc);
                    if (*(ulong *)(pcVar17 + 4) == *(ulong *)(piVar32 + 1)) goto LAB_00340367;
                  }
                  else {
LAB_00340367:
                    do {
                      if (pcVar16 + -0xc <= puVar10) {
                        if ((puVar10 < pcVar16 + -8) && ((int)*puVar15 == (int)*puVar10)) {
                          puVar10 = (ulong *)((long)puVar10 + 4);
                          puVar15 = (ulong *)((long)puVar15 + 4);
                        }
                        if ((puVar10 < pcVar16 + -6) && ((short)*puVar15 == (short)*puVar10)) {
                          puVar10 = (ulong *)((long)puVar10 + 2);
                          puVar15 = (ulong *)((long)puVar15 + 2);
                        }
                        if (puVar10 < (char *)((long)piVar9 + (long)source) + -5) {
                          puVar10 = (ulong *)((long)puVar10 +
                                             (ulong)((char)*puVar15 == (char)*puVar10));
                        }
                        uVar20 = (int)puVar10 - (int)puVar1;
                        break;
                      }
                      uVar34 = *puVar15;
                      uVar36 = *puVar10 ^ uVar34;
                      uVar6 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                        }
                      }
                      puVar25 = (ulong *)((uVar6 >> 3 & 0x1fffffff) + (long)puVar10);
                      puVar15 = puVar15 + 1;
                      bVar41 = uVar34 == *puVar10;
                      puVar10 = puVar10 + 1;
                      if (!bVar41) {
                        puVar10 = puVar25;
                      }
                      piVar31 = (int *)((ulong)piVar31 & 0xffffffff);
                      if (!bVar41) {
                        piVar31 = (int *)(ulong)(uint)((int)puVar25 - (int)puVar1);
                      }
                      uVar20 = (uint)piVar31;
                    } while (bVar41);
                  }
                  psVar5 = (short *)((long)plVar35 + 2);
                  pcVar29 = (char *)((long)plVar35 + (ulong)(uVar20 + 0xf0) / 0xff + 8);
                  if (pcVar29 <= pcVar40) {
                    if (uVar20 < 0xf) {
                      *(char *)local_b8 = (char)*local_b8 + (char)uVar20;
                    }
                    else {
                      *(char *)local_b8 = (char)*local_b8 + '\x0f';
                      uVar21 = uVar20 - 0xf;
                      psVar5[0] = -1;
                      psVar5[1] = -1;
                      if (0x3fb < uVar21) {
                        uVar39 = uVar20 - 0x40b;
                        memset((short *)((long)plVar35 + 6),0xff,(ulong)((uVar39 / 0x3fc) * 4 + 4));
                        uVar21 = uVar39 % 0x3fc;
                        psVar5 = (short *)((long)plVar35 + (ulong)((uVar39 / 0x3fc) * 4) + 6);
                      }
                      pcVar18 = (char *)((long)psVar5 + (ulong)uVar21 / 0xff);
                      psVar5 = (short *)(pcVar18 + 1);
                      *pcVar18 = (char)(uVar21 / 0xff) + (char)uVar21;
                    }
                  }
                  lVar33 = (long)piVar32 + (ulong)uVar20;
                  piVar32 = (int *)(lVar33 + 4);
                  pcVar18 = pcVar17;
                  piVar31 = piVar32;
                  plVar35 = (long *)psVar5;
                  if (pcVar40 < pcVar29) {
                    iVar37 = 1;
                    goto LAB_003405a8;
                  }
                  piVar23 = piVar32;
                  if (source + (long)piVar9 + -0xb <= piVar32) {
                    iVar37 = 3;
                    goto LAB_003405a8;
                  }
                  *(short *)((long)state +
                            (ulong)((uint)(*(int *)(lVar33 + 2) * -0x61c8864f) >> 0x13) * 2) =
                       ((short)lVar33 + 2) - sVar2;
                  uVar34 = (ulong)((uint)(*piVar32 * -0x61c8864f) >> 0x13);
                  uVar6 = (ulong)*(ushort *)((long)state + uVar34 * 2);
                  *(short *)((long)state + uVar34 * 2) = (short)piVar32 - sVar2;
                  iVar37 = *(int *)(lVar14 + uVar6);
                  iVar12 = *piVar32;
                  if (iVar37 == iVar12) {
                    *(char *)psVar5 = '\0';
                    plVar35 = (long *)((long)psVar5 + 1);
                    local_b8 = (long *)psVar5;
                  }
                  pcVar17 = (char *)(uVar6 + lVar14);
                } while (iVar37 == iVar12);
                piVar31 = (int *)(lVar33 + 5);
                uVar19 = (uint)(*(int *)(lVar33 + 5) * -0x61c8864f) >> 0x13;
                iVar37 = 0;
                pcVar18 = pcVar17;
              }
            }
LAB_003405a8:
            local_b8 = plVar35;
          } while (iVar37 == 0);
          source = (char *)piVar23;
          if (1 < iVar37 - 2U) {
            return 0;
          }
        }
        uVar34 = (long)pcVar16 - (long)source;
        pcVar18 = (char *)((long)local_b8 + (uVar34 + 0xf0) / 0xff + uVar34 + 1);
        if (pcVar18 <= pcVar40) {
          if (uVar34 < 0xf) {
            *(char *)local_b8 = (char)uVar34 << 4;
          }
          else {
            uVar6 = uVar34 - 0xf;
            *(char *)local_b8 = -0x10;
            psVar5 = (short *)((long)local_b8 + 1);
            if (0xfe < uVar6) {
              uVar36 = (uVar34 - 0x10e) / 0xff;
              memset((short *)((long)local_b8 + 1),0xff,uVar36 + 1);
              uVar6 = (uVar36 * -0xff + uVar34) - 0x10e;
              psVar5 = (short *)((long)local_b8 + uVar36 + 2);
            }
            local_b8 = (long *)psVar5;
            *(char *)local_b8 = (char)uVar6;
          }
          memcpy((char *)((long)local_b8 + 1),source,uVar34);
          local_b8 = (long *)((long)local_b8 + uVar34 + 1);
        }
        if (pcVar18 <= pcVar40) {
          return (int)local_b8 - iVar38;
        }
        return 0;
      }
      if (maxOutputSize < 1) {
        return 0;
      }
LAB_0033fff9:
      *dest = '\0';
      return 1;
    }
    if ((uint)inputSize < 0x7e000001) {
      piVar31 = (int *)0xcf1bbcdcbb000000;
      uVar19 = *(uint *)((long)state + 0x4010);
      lVar14 = (long)source - (ulong)uVar19;
      *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
      pcVar18 = dest + maxOutputSize;
      *(uint *)((long)state + 0x4010) = inputSize + uVar19;
      *(undefined4 *)((long)state + 0x4014) = 2;
      *(uint *)((long)state + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar19
      ;
      plVar35 = (long *)(source + 1);
      uVar34 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
      local_b0 = (long *)source;
      do {
        uVar20 = 1;
        uVar19 = iVar7 << 6;
        while( true ) {
          plVar22 = (long *)((ulong)uVar20 + (long)plVar35);
          iVar37 = (int)plVar35;
          iVar12 = (int)lVar14;
          if (source + (long)piVar9 + -0xb < plVar22) {
            iVar11 = 2;
          }
          else {
            uVar20 = *(uint *)((long)state + uVar34 * 4);
            piVar31 = (int *)((ulong)uVar20 + lVar14);
            uVar6 = (ulong)(*plVar22 * -0x30e4432345000000) >> 0x34;
            *(int *)((long)state + uVar34 * 4) = iVar37 - iVar12;
            iVar11 = 8;
            uVar34 = uVar6;
            if (((uint)(iVar37 - iVar12) <= uVar20 + 0xffff) &&
               (iVar11 = 7, *piVar31 != (int)*plVar35)) {
              iVar11 = 0;
            }
          }
          if ((iVar11 != 0) && (iVar11 != 8)) break;
          uVar20 = uVar19 >> 6;
          uVar19 = uVar19 + 1;
          plVar35 = plVar22;
        }
        if (iVar11 == 7) {
          iVar11 = 0;
        }
        plVar22 = (long *)dest;
        if (iVar11 == 0) {
          uVar20 = iVar37 - (int)local_b0;
          lVar33 = 0;
          uVar19 = uVar20 - 0xf;
          cVar3 = (char)plVar35 * '\x10' + (char)local_b0 * -0x10;
          do {
            cVar28 = cVar3;
            uVar21 = uVar19;
            lVar30 = lVar33;
            piVar23 = (int *)((long)piVar31 + lVar30);
            plVar4 = (long *)((long)plVar35 + lVar30);
            if ((piVar23 <= source) || (plVar4 <= local_b0)) break;
            lVar33 = lVar30 + -1;
            uVar19 = uVar21 - 1;
            cVar3 = cVar28 + -0x10;
          } while (*(char *)((long)plVar35 + lVar30 + -1) == *(char *)((long)piVar31 + lVar30 + -1))
          ;
          iVar11 = (int)lVar30;
          uVar6 = (ulong)(uint)(iVar11 + (iVar37 - (int)local_b0));
          plVar22 = (long *)((long)dest + 1);
          pcVar16 = (char *)((long)dest + ((ulong)uVar20 + lVar30 & 0xffffffff) / 0xff + uVar6 + 9);
          if (pcVar18 < pcVar16) {
            iVar11 = 1;
          }
          else {
            if ((uint)((ulong)uVar20 + lVar30) < 0xf) {
              *dest = cVar28;
              plVar35 = plVar22;
            }
            else {
              uVar36 = (ulong)(uVar20 - 0xf) + lVar30;
              *dest = -0x10;
              if (0xfe < (int)uVar36) {
                if (0x1fc < (int)uVar21) {
                  uVar21 = 0x1fd;
                }
                uVar19 = (uVar20 - uVar21) + iVar11 + 0xef;
                uVar36 = (ulong)uVar19 / 0xff;
                memset(plVar22,0xff,(ulong)(uVar19 / 0xff + 1));
                plVar22 = (long *)((long)dest + uVar36 + 2);
                uVar36 = (ulong)((uVar20 - 0x10e) + iVar11 + (int)uVar36 * -0xff);
              }
              *(char *)plVar22 = (char)uVar36;
              plVar35 = (long *)((long)plVar22 + 1);
            }
            plVar22 = (long *)(uVar6 + (long)plVar35);
            plVar8 = local_b0;
            do {
              *plVar35 = *plVar8;
              plVar35 = plVar35 + 1;
              plVar8 = plVar8 + 1;
            } while (plVar35 < plVar22);
            iVar11 = 0;
          }
          plVar35 = plVar4;
          piVar31 = piVar23;
          if (pcVar16 <= pcVar18) {
            do {
              uVar6 = 0xcf1bbcdcbb000000;
              *(short *)plVar22 = (short)plVar4 - (short)piVar23;
              puVar1 = (ulong *)((long)plVar4 + 4);
              puVar15 = (ulong *)(piVar23 + 1);
              puVar10 = puVar1;
              if (puVar1 < source + (long)piVar9 + -0xc) {
                uVar36 = *(ulong *)((long)plVar4 + 4) ^ *(ulong *)(piVar23 + 1);
                uVar6 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                  }
                }
                uVar6 = uVar6 >> 3 & 0x1fffffff;
                uVar19 = (uint)uVar6;
                puVar10 = (ulong *)((long)plVar4 + 0xc);
                puVar15 = (ulong *)(piVar23 + 3);
                if (*(ulong *)(piVar23 + 1) == *(ulong *)((long)plVar4 + 4)) goto LAB_0033f7c2;
              }
              else {
LAB_0033f7c2:
                do {
                  if (source + (long)piVar9 + -0xc <= puVar10) {
                    if ((puVar10 < source + -8 + (long)piVar9) && ((int)*puVar15 == (int)*puVar10))
                    {
                      puVar10 = (ulong *)((long)puVar10 + 4);
                      puVar15 = (ulong *)((long)puVar15 + 4);
                    }
                    if ((puVar10 < source + -6 + (long)piVar9) &&
                       ((short)*puVar15 == (short)*puVar10)) {
                      puVar10 = (ulong *)((long)puVar10 + 2);
                      puVar15 = (ulong *)((long)puVar15 + 2);
                    }
                    if (puVar10 < source + -5 + (long)piVar9) {
                      puVar10 = (ulong *)((long)puVar10 + (ulong)((char)*puVar15 == (char)*puVar10))
                      ;
                    }
                    uVar19 = (int)puVar10 - (int)puVar1;
                    break;
                  }
                  uVar36 = *puVar15;
                  uVar24 = *puVar10 ^ uVar36;
                  uVar27 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                    }
                  }
                  puVar25 = (ulong *)((uVar27 >> 3 & 0x1fffffff) + (long)puVar10);
                  puVar15 = puVar15 + 1;
                  bVar41 = uVar36 == *puVar10;
                  puVar10 = puVar10 + 1;
                  if (!bVar41) {
                    puVar10 = puVar25;
                  }
                  uVar6 = uVar6 & 0xffffffff;
                  if (!bVar41) {
                    uVar6 = (ulong)(uint)((int)puVar25 - (int)puVar1);
                  }
                  uVar19 = (uint)uVar6;
                } while (bVar41);
              }
              plVar8 = (long *)((long)plVar22 + 2);
              pcVar16 = (char *)((long)plVar22 + (ulong)(uVar19 + 0xf0) / 0xff + 8);
              if (pcVar16 <= pcVar18) {
                if (uVar19 < 0xf) {
                  *dest = (char)*(long *)dest + (char)uVar19;
                }
                else {
                  *dest = (char)*(long *)dest + '\x0f';
                  uVar20 = uVar19 - 0xf;
                  *(undefined4 *)plVar8 = 0xffffffff;
                  if (0x3fb < uVar20) {
                    uVar21 = uVar19 - 0x40b;
                    memset((char *)((long)plVar22 + 6),0xff,(ulong)((uVar21 / 0x3fc) * 4 + 4));
                    uVar20 = uVar21 % 0x3fc;
                    plVar8 = (long *)((long)plVar22 + (ulong)((uVar21 / 0x3fc) * 4) + 6);
                  }
                  pcVar40 = (char *)((long)plVar8 + (ulong)uVar20 / 0xff);
                  plVar8 = (long *)(pcVar40 + 1);
                  *pcVar40 = (char)(uVar20 / 0xff) + (char)uVar20;
                }
              }
              lVar33 = (ulong)uVar19 + (long)plVar4;
              plVar4 = (long *)(lVar33 + 4);
              plVar35 = plVar4;
              piVar31 = piVar23;
              plVar22 = plVar8;
              if (pcVar18 < pcVar16) {
                iVar11 = 1;
                goto LAB_0033fa37;
              }
              local_b0 = plVar4;
              if (source + (long)piVar9 + -0xb <= plVar4) {
                iVar11 = 3;
                goto LAB_0033fa37;
              }
              *(int *)((long)state +
                      ((ulong)(*(long *)(lVar33 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
                   ((int)lVar33 + 2) - iVar12;
              uVar6 = (ulong)(*plVar4 * -0x30e4432345000000) >> 0x34;
              uVar20 = (int)plVar4 - iVar12;
              uVar19 = *(uint *)((long)state + uVar6 * 4);
              piVar23 = (int *)((ulong)uVar19 + lVar14);
              *(uint *)((long)state + uVar6 * 4) = uVar20;
              bVar41 = true;
              if ((uVar20 <= uVar19 + 0xffff) && (*piVar23 == *(int *)plVar4)) {
                *(char *)plVar8 = '\0';
                bVar41 = false;
                dest = (char *)plVar8;
                plVar8 = (long *)((long)plVar8 + 1);
              }
              plVar22 = plVar8;
            } while (!bVar41);
            uVar34 = (ulong)(*(long *)(lVar33 + 5) * -0x30e4432345000000) >> 0x34;
            iVar11 = 0;
            plVar35 = (long *)(lVar33 + 5);
            piVar31 = piVar23;
          }
        }
LAB_0033fa37:
        dest = (char *)plVar22;
      } while (iVar11 == 0);
      if (iVar11 - 2U < 2) {
        uVar34 = (long)(source + (long)piVar9) - (long)local_b0;
        pcVar16 = (char *)((long)plVar22 + (uVar34 + 0xf0) / 0xff + uVar34 + 1);
        if (pcVar16 <= pcVar18) {
          if (uVar34 < 0xf) {
            *(char *)plVar22 = (char)uVar34 << 4;
          }
          else {
            uVar6 = uVar34 - 0xf;
            *(char *)plVar22 = -0x10;
            plVar35 = (long *)((long)plVar22 + 1);
            if (0xfe < uVar6) {
              uVar6 = (uVar34 - 0x10e) / 0xff;
              memset(plVar35,0xff,uVar6 + 1);
              plVar35 = (long *)((long)plVar22 + uVar6 + 2);
              uVar6 = (uVar6 * -0xff + uVar34) - 0x10e;
            }
            *(char *)plVar35 = (char)uVar6;
            plVar22 = plVar35;
          }
          memcpy((char *)((long)plVar22 + 1),local_b0,uVar34);
          plVar22 = (long *)((long)plVar22 + uVar34 + 1);
        }
        if (pcVar16 <= pcVar18) {
          return (int)plVar22 - iVar38;
        }
      }
    }
  }
  else if (inputSize < 0x1000b) {
    if ((uint)inputSize < 0x7e000001) {
      if (inputSize != 0) {
        uVar19 = *(uint *)((long)state + 0x4010);
        pcVar18 = source + (long)piVar9;
        *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
        *(uint *)((long)state + 0x4010) = uVar19 + inputSize;
        *(undefined4 *)((long)state + 0x4014) = 3;
        if (0xc < inputSize) {
          lVar14 = (long)source - (ulong)uVar19;
          *(short *)((long)state + (ulong)((uint)(*(int *)source * -0x61c8864f) >> 0x13) * 2) =
               (short)uVar19;
          piVar31 = (int *)(source + 1);
          uVar19 = (uint)(*(int *)(source + 1) * -0x61c8864f) >> 0x13;
          pcVar16 = dest;
          piVar23 = (int *)source;
          do {
            uVar21 = 1;
            piVar32 = piVar31;
            uVar20 = iVar7 << 6;
            do {
              piVar31 = piVar32;
              piVar32 = (int *)((ulong)uVar21 + (long)piVar31);
              sVar2 = (short)lVar14;
              if (source + (long)piVar9 + -0xb < piVar32) {
                iVar37 = 2;
              }
              else {
                uVar34 = (ulong)*(ushort *)((long)state + (ulong)uVar19 * 2);
                iVar12 = *piVar32;
                *(short *)((long)state + (ulong)uVar19 * 2) = (short)piVar31 - sVar2;
                iVar37 = 7;
                if (*(int *)(lVar14 + uVar34) != *piVar31) {
                  iVar37 = 0;
                }
                pcVar16 = (char *)(uVar34 + lVar14);
                uVar19 = (uint)(iVar12 * -0x61c8864f) >> 0x13;
              }
              uVar21 = uVar20 >> 6;
              uVar20 = uVar20 + 1;
            } while (iVar37 == 0);
            if (iVar37 == 7) {
              iVar37 = 0;
            }
            if (iVar37 == 0) {
              iVar37 = (int)piVar31 - (int)piVar23;
              lVar33 = 0;
              cVar3 = (char)piVar31 * '\x10' + (char)piVar23 * -0x10;
              uVar20 = iVar37 - 0xfU;
              do {
                uVar21 = uVar20;
                cVar28 = cVar3;
                lVar30 = lVar33;
                pcVar40 = pcVar16 + lVar30;
                piVar32 = (int *)((long)piVar31 + lVar30);
                if ((pcVar40 <= source) || (piVar32 <= piVar23)) break;
                lVar33 = lVar30 + -1;
                cVar3 = cVar28 + -0x10;
                uVar20 = uVar21 - 1;
              } while (*(char *)((long)piVar31 + lVar30 + -1) == pcVar16[lVar30 + -1]);
              iVar12 = (int)lVar30;
              psVar5 = (short *)((long)dest + 1);
              if ((uint)(iVar37 + iVar12) < 0xf) {
                *dest = cVar28;
              }
              else {
                uVar34 = (ulong)(iVar37 - 0xfU) + lVar30;
                *dest = -0x10;
                if (0xfe < (int)uVar34) {
                  if (0x1fc < (int)uVar21) {
                    uVar21 = 0x1fd;
                  }
                  uVar20 = (iVar37 - uVar21) + iVar12 + 0xef;
                  memset(psVar5,0xff,(ulong)(uVar20 / 0xff + 1));
                  psVar5 = (short *)((long)dest + (ulong)uVar20 / 0xff + 2);
                  uVar34 = (ulong)(iVar37 + -0x10e + iVar12 + uVar20 / 0xff);
                }
                *(char *)psVar5 = (char)uVar34;
                psVar5 = (short *)((long)psVar5 + 1);
              }
              psVar26 = (short *)((ulong)(uint)((int)piVar32 - (int)piVar23) + (long)psVar5);
              do {
                *(undefined8 *)psVar5 = *(undefined8 *)piVar23;
                psVar5 = psVar5 + 4;
                piVar23 = piVar23 + 2;
                local_b8 = (long *)dest;
              } while (psVar5 < psVar26);
              do {
                *psVar26 = (short)piVar32 - (short)pcVar40;
                puVar1 = (ulong *)(piVar32 + 1);
                puVar10 = (ulong *)(pcVar40 + 4);
                puVar15 = puVar1;
                if (puVar1 < pcVar18 + -0xc) {
                  uVar6 = *(ulong *)(piVar32 + 1) ^ *(ulong *)(pcVar40 + 4);
                  uVar34 = 0;
                  if (uVar6 != 0) {
                    for (; (uVar6 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                    }
                  }
                  uVar34 = uVar34 >> 3 & 0x1fffffff;
                  puVar15 = (ulong *)(piVar32 + 3);
                  puVar10 = (ulong *)(pcVar40 + 0xc);
                  if (*(ulong *)(pcVar40 + 4) == *(ulong *)(piVar32 + 1)) goto LAB_0034085d;
                }
                else {
LAB_0034085d:
                  do {
                    if (pcVar18 + -0xc <= puVar15) {
                      if ((puVar15 < pcVar18 + -8) && ((int)*puVar10 == (int)*puVar15)) {
                        puVar15 = (ulong *)((long)puVar15 + 4);
                        puVar10 = (ulong *)((long)puVar10 + 4);
                      }
                      if ((puVar15 < pcVar18 + -6) && ((short)*puVar10 == (short)*puVar15)) {
                        puVar15 = (ulong *)((long)puVar15 + 2);
                        puVar10 = (ulong *)((long)puVar10 + 2);
                      }
                      if (puVar15 < (char *)((long)piVar9 + (long)source) + -5) {
                        puVar15 = (ulong *)((long)puVar15 +
                                           (ulong)((char)*puVar10 == (char)*puVar15));
                      }
                      uVar34 = (ulong)(uint)((int)puVar15 - (int)puVar1);
                      goto LAB_00340898;
                    }
                    uVar34 = *puVar10;
                    uVar6 = *puVar15;
                    uVar27 = uVar6 ^ uVar34;
                    uVar36 = 0;
                    if (uVar27 != 0) {
                      for (; (uVar27 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                      }
                    }
                    iVar37 = (int)puVar15;
                    puVar10 = puVar10 + 1;
                    puVar15 = puVar15 + 1;
                  } while (uVar34 == uVar6);
                  uVar34 = (ulong)((((uint)(uVar36 >> 3) & 0x1fffffff) + iVar37) - (int)puVar1);
                }
LAB_00340898:
                dest = (char *)(psVar26 + 1);
                uVar20 = (uint)uVar34;
                if (uVar20 < 0xf) {
                  *(char *)local_b8 = (char)*local_b8 + (char)uVar34;
                }
                else {
                  *(char *)local_b8 = (char)*local_b8 + '\x0f';
                  uVar21 = uVar20 - 0xf;
                  *(short *)((long)dest + 0) = -1;
                  *(short *)((long)dest + 2) = -1;
                  if (0x3fb < uVar21) {
                    uVar20 = uVar20 - 0x40b;
                    memset(psVar26 + 3,0xff,(ulong)((uVar20 / 0x3fc) * 4 + 4));
                    uVar21 = uVar20 % 0x3fc;
                    dest = (char *)((long)psVar26 + (ulong)((uVar20 / 0x3fc) * 4) + 6);
                  }
                  pcVar16 = (char *)((long)dest + (ulong)uVar21 / 0xff);
                  dest = pcVar16 + 1;
                  *pcVar16 = (char)(uVar21 / 0xff) + (char)uVar21;
                }
                lVar33 = (long)piVar32 + uVar34;
                piVar32 = (int *)(lVar33 + 4);
                piVar23 = piVar32;
                if (source + (long)piVar9 + -0xb <= piVar32) {
                  iVar37 = 3;
                  pcVar16 = pcVar40;
                  piVar31 = piVar32;
                  goto LAB_003409dc;
                }
                *(short *)((long)state +
                          (ulong)((uint)(*(int *)(lVar33 + 2) * -0x61c8864f) >> 0x13) * 2) =
                     ((short)lVar33 + 2) - sVar2;
                uVar34 = (ulong)((uint)(*piVar32 * -0x61c8864f) >> 0x13);
                uVar6 = (ulong)*(ushort *)((long)state + uVar34 * 2);
                *(short *)((long)state + uVar34 * 2) = (short)piVar32 - sVar2;
                iVar37 = *(int *)(lVar14 + uVar6);
                iVar12 = *piVar32;
                psVar26 = (short *)dest;
                if (iVar37 == iVar12) {
                  *dest = '\0';
                  psVar26 = (short *)((long)dest + 1);
                  local_b8 = (long *)dest;
                }
                pcVar40 = (char *)(uVar6 + lVar14);
              } while (iVar37 == iVar12);
              uVar19 = (uint)(*(int *)(lVar33 + 5) * -0x61c8864f) >> 0x13;
              iVar37 = 0;
              dest = (char *)psVar26;
              pcVar16 = pcVar40;
              piVar31 = (int *)(lVar33 + 5);
            }
LAB_003409dc:
          } while (iVar37 == 0);
          source = (char *)piVar23;
          if (1 < iVar37 - 2U) {
            return 0;
          }
        }
        uVar34 = (long)pcVar18 - (long)source;
        if (uVar34 < 0xf) {
          *dest = (char)uVar34 << 4;
        }
        else {
          uVar6 = uVar34 - 0xf;
          *dest = -0x10;
          psVar5 = (short *)((long)dest + 1);
          if (0xfe < uVar6) {
            uVar6 = (uVar34 - 0x10e) / 0xff;
            memset(psVar5,0xff,uVar6 + 1);
            psVar5 = (short *)((long)dest + uVar6 + 2);
            uVar6 = (uVar6 * -0xff + uVar34) - 0x10e;
          }
          *(char *)psVar5 = (char)uVar6;
          dest = (char *)psVar5;
        }
        memcpy((char *)((long)dest + 1),source,uVar34);
        return ((int)(char *)((long)dest + 1) + (int)uVar34) - iVar38;
      }
      goto LAB_0033fff9;
    }
  }
  else if ((uint)inputSize < 0x7e000001) {
    uVar19 = *(uint *)((long)state + 0x4010);
    lVar14 = (long)source - (ulong)uVar19;
    pcVar18 = source + (long)piVar9;
    pcVar16 = source + (long)piVar9;
    *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
    pcVar40 = source + (long)piVar9;
    *(uint *)((long)state + 0x4010) = inputSize + uVar19;
    *(undefined4 *)((long)state + 0x4014) = 2;
    *(uint *)((long)state + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar19;
    plVar35 = (long *)(source + 1);
    uVar34 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
    pcVar17 = source + (long)piVar9;
    puVar1 = (ulong *)(source + -8 + (long)piVar9);
    puVar15 = (ulong *)(source + -6 + (long)piVar9);
    plVar22 = (long *)source;
    do {
      uVar20 = 1;
      uVar19 = iVar7 << 6;
      while( true ) {
        plVar4 = (long *)((ulong)uVar20 + (long)plVar35);
        iVar37 = (int)lVar14;
        if (pcVar16 + -0xb < plVar4) {
          iVar12 = 2;
        }
        else {
          uVar20 = *(uint *)((long)state + uVar34 * 4);
          uVar21 = (int)plVar35 - iVar37;
          piVar9 = (int *)((ulong)uVar20 + lVar14);
          uVar6 = (ulong)(*plVar4 * -0x30e4432345000000) >> 0x34;
          *(uint *)((long)state + uVar34 * 4) = uVar21;
          iVar12 = 8;
          uVar34 = uVar6;
          if ((uVar21 <= uVar20 + 0xffff) && (iVar12 = 7, *piVar9 != (int)*plVar35)) {
            iVar12 = 0;
          }
        }
        if ((iVar12 != 0) && (iVar12 != 8)) break;
        uVar20 = uVar19 >> 6;
        uVar19 = uVar19 + 1;
        plVar35 = plVar4;
      }
      if (iVar12 == 7) {
        iVar12 = 0;
      }
      if (iVar12 == 0) {
        iVar12 = (int)plVar35 - (int)plVar22;
        lVar33 = 0;
        uVar19 = iVar12 - 0xfU;
        cVar3 = (char)plVar35 * '\x10' + (char)plVar22 * -0x10;
        do {
          cVar28 = cVar3;
          uVar20 = uVar19;
          lVar30 = lVar33;
          piVar31 = (int *)((long)piVar9 + lVar30);
          plVar4 = (long *)((long)plVar35 + lVar30);
          if ((piVar31 <= source) || (plVar4 <= plVar22)) break;
          lVar33 = lVar30 + -1;
          uVar19 = uVar20 - 1;
          cVar3 = cVar28 + -0x10;
        } while (*(char *)((long)plVar35 + lVar30 + -1) == *(char *)((long)piVar9 + lVar30 + -1));
        iVar11 = (int)lVar30;
        plVar35 = (long *)((long)dest + 1);
        if ((uint)(iVar12 + iVar11) < 0xf) {
          *dest = cVar28;
        }
        else {
          uVar6 = (ulong)(iVar12 - 0xfU) + lVar30;
          *dest = -0x10;
          if (0xfe < (int)uVar6) {
            if (0x1fc < (int)uVar20) {
              uVar20 = 0x1fd;
            }
            uVar19 = (iVar12 - uVar20) + iVar11 + 0xef;
            uVar6 = (ulong)uVar19 / 0xff;
            memset(plVar35,0xff,(ulong)(uVar19 / 0xff + 1));
            plVar35 = (long *)((long)dest + uVar6 + 2);
            uVar6 = (ulong)(uint)(iVar12 + -0x10e + iVar11 + (int)uVar6 * -0xff);
          }
          *(char *)plVar35 = (char)uVar6;
          plVar35 = (long *)((long)plVar35 + 1);
        }
        plVar8 = (long *)((ulong)(uint)((int)plVar4 - (int)plVar22) + (long)plVar35);
        do {
          *plVar35 = *plVar22;
          plVar35 = plVar35 + 1;
          plVar22 = plVar22 + 1;
          piVar9 = piVar31;
          local_b8 = (long *)dest;
        } while (plVar35 < plVar8);
        do {
          *(short *)plVar8 = (short)plVar4 - (short)piVar9;
          puVar10 = (ulong *)((long)plVar4 + 4);
          puVar13 = (ulong *)(piVar9 + 1);
          puVar25 = puVar10;
          if (puVar10 < pcVar17 + -0xc) {
            uVar36 = *(ulong *)((long)plVar4 + 4) ^ *(ulong *)(piVar9 + 1);
            uVar6 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            uVar6 = uVar6 >> 3 & 0x1fffffff;
            puVar25 = (ulong *)((long)plVar4 + 0xc);
            puVar13 = (ulong *)(piVar9 + 3);
            if (*(ulong *)(piVar9 + 1) == *(ulong *)((long)plVar4 + 4)) goto LAB_0033fd64;
          }
          else {
LAB_0033fd64:
            do {
              if (pcVar17 + -0xc <= puVar25) {
                if ((puVar25 < puVar1) && ((int)*puVar13 == (int)*puVar25)) {
                  puVar25 = (ulong *)((long)puVar25 + 4);
                  puVar13 = (ulong *)((long)puVar13 + 4);
                }
                if ((puVar25 < puVar15) && ((short)*puVar13 == (short)*puVar25)) {
                  puVar25 = (ulong *)((long)puVar25 + 2);
                  puVar13 = (ulong *)((long)puVar13 + 2);
                }
                if (puVar25 < pcVar40 + -5) {
                  puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar13 == (char)*puVar25));
                }
                uVar6 = (ulong)(uint)((int)puVar25 - (int)puVar10);
                goto LAB_0033fd9f;
              }
              uVar6 = *puVar13;
              uVar36 = *puVar25;
              uVar24 = uVar36 ^ uVar6;
              uVar27 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              iVar12 = (int)puVar25;
              puVar13 = puVar13 + 1;
              puVar25 = puVar25 + 1;
            } while (uVar6 == uVar36);
            uVar6 = (ulong)((((uint)(uVar27 >> 3) & 0x1fffffff) + iVar12) - (int)puVar10);
          }
LAB_0033fd9f:
          dest = (char *)((long)plVar8 + 2);
          uVar19 = (uint)uVar6;
          if (uVar19 < 0xf) {
            *(char *)local_b8 = (char)*local_b8 + (char)uVar6;
          }
          else {
            *(char *)local_b8 = (char)*local_b8 + '\x0f';
            uVar20 = uVar19 - 0xf;
            *(undefined4 *)dest = 0xffffffff;
            if (0x3fb < uVar20) {
              uVar19 = uVar19 - 0x40b;
              memset((char *)((long)plVar8 + 6),0xff,(ulong)((uVar19 / 0x3fc) * 4 + 4));
              uVar20 = uVar19 % 0x3fc;
              dest = (char *)((long)plVar8 + (ulong)((uVar19 / 0x3fc) * 4) + 6);
            }
            pcVar29 = (char *)((long)dest + (ulong)uVar20 / 0xff);
            dest = pcVar29 + 1;
            *pcVar29 = (char)(uVar20 / 0xff) + (char)uVar20;
          }
          lVar33 = (long)plVar4 + uVar6;
          plVar4 = (long *)(lVar33 + 4);
          plVar22 = plVar4;
          if (pcVar16 + -0xb <= plVar4) {
            iVar12 = 3;
            plVar35 = plVar4;
            goto LAB_0033ff19;
          }
          *(int *)((long)state + ((ulong)(*(long *)(lVar33 + 2) * -0x30e4432345000000) >> 0x34) * 4)
               = ((int)lVar33 + 2) - iVar37;
          uVar6 = (ulong)(*plVar4 * -0x30e4432345000000) >> 0x34;
          uVar20 = (int)plVar4 - iVar37;
          uVar19 = *(uint *)((long)state + uVar6 * 4);
          piVar9 = (int *)((ulong)uVar19 + lVar14);
          *(uint *)((long)state + uVar6 * 4) = uVar20;
          bVar41 = true;
          plVar8 = (long *)dest;
          if ((uVar20 <= uVar19 + 0xffff) && (*piVar9 == *(int *)plVar4)) {
            *dest = '\0';
            bVar41 = false;
            plVar8 = (long *)((long)dest + 1);
            local_b8 = (long *)dest;
          }
        } while (!bVar41);
        uVar34 = (ulong)(*(long *)(lVar33 + 5) * -0x30e4432345000000) >> 0x34;
        iVar12 = 0;
        dest = (char *)plVar8;
        plVar35 = (long *)(lVar33 + 5);
      }
LAB_0033ff19:
    } while (iVar12 == 0);
    if (iVar12 - 2U < 2) {
      uVar34 = (long)pcVar18 - (long)plVar22;
      if (uVar34 < 0xf) {
        *dest = (char)uVar34 << 4;
      }
      else {
        uVar6 = uVar34 - 0xf;
        *dest = -0x10;
        plVar35 = (long *)((long)dest + 1);
        if (0xfe < uVar6) {
          uVar6 = (uVar34 - 0x10e) / 0xff;
          memset(plVar35,0xff,uVar6 + 1);
          plVar35 = (long *)((long)dest + uVar6 + 2);
          uVar6 = (uVar6 * -0xff + uVar34) - 0x10e;
        }
        *(char *)plVar35 = (char)uVar6;
        dest = (char *)plVar35;
      }
      memcpy((char *)((long)dest + 1),plVar22,uVar34);
      return ((int)(char *)((long)dest + 1) + (int)uVar34) - iVar38;
    }
  }
  return 0;
}

Assistant:

int LZ4_compress_fast_extState(void* state, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* const ctx = & LZ4_initStream(state, sizeof(LZ4_stream_t)) -> internal_donotuse;
    assert(ctx != NULL);
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;
    if (maxOutputSize >= LZ4_compressBound(inputSize)) {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}